

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

ssize_t __thiscall DomLayoutDefault::write(DomLayoutDefault *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  char16_t *pcVar2;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar3;
  undefined4 in_register_00000034;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar4;
  long in_FS_OFFSET;
  QAnyStringView QVar5;
  QAnyStringView QVar6;
  QAnyStringView QVar7;
  QAnyStringView QVar8;
  QAnyStringView QVar9;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  aVar4._4_4_ = in_register_00000034;
  aVar4._0_4_ = __fd;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)((long)__buf + 0x10);
  if (lVar1 == 0) {
    local_50.d = (Data *)0x0;
    local_68.d = (Data *)0x0;
    local_68.ptr = (char16_t *)0x0;
    local_68.size = 0;
    local_50.ptr = L"layoutdefault";
    local_50.size = 0xd;
  }
  else {
    QString::toLower_helper((QString *)&local_50);
  }
  QVar5.m_size = (size_t)local_50.ptr;
  QVar5.field_0.m_data = aVar4.m_data;
  QXmlStreamWriter::writeStartElement(QVar5);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  if (lVar1 == 0) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  }
  if (this->m_has_attr_spacing == true) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"spacing",7);
    pcVar2 = local_50.ptr;
    aVar3.m_data = (void *)(local_50.size | 0x8000000000000000);
    QString::number((int)&local_80,this->m_attr_spacing);
    QVar6.m_size = (size_t)pcVar2;
    QVar6.field_0.m_data = aVar4.m_data;
    QVar8.m_size = (size_t)local_80.ptr;
    QVar8.field_0.m_data = aVar3.m_data;
    QXmlStreamWriter::writeAttribute(QVar6,QVar8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  if (this->m_has_attr_margin == true) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"margin",6);
    pcVar2 = local_50.ptr;
    aVar3.m_data = (void *)(local_50.size | 0x8000000000000000);
    QString::number((int)&local_80,this->m_attr_margin);
    QVar7.m_size = (size_t)pcVar2;
    QVar7.field_0.m_data = aVar4.m_data;
    QVar9.m_size = (size_t)local_80.ptr;
    QVar9.field_0.m_data = aVar3.m_data;
    QXmlStreamWriter::writeAttribute(QVar7,QVar9);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomLayoutDefault::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("layoutdefault") : tagName.toLower());

    if (hasAttributeSpacing())
        writer.writeAttribute(u"spacing"_s, QString::number(attributeSpacing()));

    if (hasAttributeMargin())
        writer.writeAttribute(u"margin"_s, QString::number(attributeMargin()));

    writer.writeEndElement();
}